

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_node_unlink(lys_node *node)

{
  ly_ctx *plVar1;
  ly_ctx *plVar2;
  bool bVar3;
  LY_STMT stmt;
  lys_module *plVar4;
  lys_module *plVar5;
  ly_ctx *plVar6;
  lys_node *ext;
  
  if (node == (lys_node *)0x0) {
    return;
  }
  plVar4 = node->module;
  if (plVar4 != (lys_module *)0x0) {
    if ((plVar4->field_0x40 & 1) != 0) {
      plVar4 = (lys_module *)plVar4->data;
    }
    if (plVar4->data == node) {
      plVar4->data = node->next;
    }
  }
  ext = node->parent;
  bVar3 = true;
  if (ext == (lys_node *)0x0) {
LAB_00152c10:
    ext = (lys_node *)0x0;
    goto LAB_00152c30;
  }
  plVar4 = (lys_module *)(ulong)ext->nodetype;
  if (ext->nodetype == LYS_AUGMENT) {
    if (ext->child == node) {
      plVar4 = (lys_module *)node->next;
      ext->child = (lys_node *)plVar4;
    }
    if (((ext->flags & 1) != 0) || (ext = ext->prev, ext == (lys_node *)0x0)) goto LAB_00152c10;
    plVar4 = (lys_module *)(ulong)ext->nodetype;
  }
  if ((int)plVar4 == 0x10000) {
    stmt = lys_snode2stmt(node->nodetype);
    plVar4 = (lys_module *)
             lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)ext,(lyext_substmt **)0x0)
    ;
    if (plVar4->ctx == (ly_ctx *)node) {
LAB_00152c1f:
      plVar4->ctx = (ly_ctx *)node->next;
    }
  }
  else if (ext->child == node) {
    plVar4 = (lys_module *)&ext->child;
    goto LAB_00152c1f;
  }
  node->parent = (lys_node *)0x0;
  bVar3 = false;
LAB_00152c30:
  if (node->prev != node) {
    plVar1 = (ly_ctx *)node->next;
    plVar6 = plVar1;
    if (plVar1 == (ly_ctx *)0x0) {
      plVar2 = (ly_ctx *)node;
      if (bVar3) {
        do {
          plVar6 = plVar2;
          plVar2 = *(ly_ctx **)&(plVar6->dict).recs[3].field_0x10;
        } while ((lys_node *)(plVar2->dict).recs[3].value != (lys_node *)0x0);
      }
      else {
        plVar5 = (lys_module *)&ext->child;
        if (ext->nodetype == LYS_EXT) {
          plVar5 = plVar4;
        }
        plVar6 = plVar5->ctx;
      }
    }
    *(lys_node **)&(plVar6->dict).recs[3].field_0x10 = node->prev;
    if (node->prev->next != (lys_node *)0x0) {
      node->prev->next = (lys_node *)plVar1;
    }
    node->next = (lys_node *)0x0;
    node->prev = node;
  }
  return;
}

Assistant:

void
lys_node_unlink(struct lys_node *node)
{
    struct lys_node *parent, *first, **pp;
    struct lys_module *main_module;

    if (!node) {
        return;
    }

    /* unlink from data model if necessary */
    if (node->module) {
        /* get main module with data tree */
        main_module = lys_node_module(node);
        if (main_module->data == node) {
            main_module->data = node->next;
        }
    }

    /* store pointers to important nodes */
    parent = node->parent;
    if (parent && (parent->nodetype == LYS_AUGMENT)) {
        /* handle augments - first, unlink it from the augment parent ... */
        if (parent->child == node) {
            parent->child = node->next;
        }

        if (parent->flags & LYS_NOTAPPLIED) {
            /* data are not connected in the target, so we cannot continue with the target as a parent */
            parent = NULL;
        } else {
            /* data are connected in target, so we will continue with the target as a parent */
            parent = ((struct lys_node_augment *)parent)->target;
        }
    }

    /* unlink from parent */
    if (parent) {
        if (parent->nodetype == LYS_EXT) {
            pp = (struct lys_node **)lys_ext_complex_get_substmt(lys_snode2stmt(node->nodetype),
                                                                 (struct lys_ext_instance_complex*)parent, NULL);
            if (*pp == node) {
                *pp = node->next;
            }
        } else if (parent->child == node) {
            parent->child = node->next;
        }
        node->parent = NULL;
    }

    /* unlink from siblings */
    if (node->prev == node) {
        /* there are no more siblings */
        return;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last element */
        if (parent) {
            if (parent->nodetype == LYS_EXT) {
                first = *(struct lys_node **)pp;
            } else {
                first = parent->child;
            }
        } else {
            first = node;
            while (first->prev->next) {
                first = first->prev;
            }
        }
        first->prev = node->prev;
    }
    if (node->prev->next) {
        node->prev->next = node->next;
    }

    /* clean up the unlinked element */
    node->next = NULL;
    node->prev = node;
}